

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonAnalyticalPricer.cpp
# Opt level: O1

double __thiscall
VarianceSwapsHestonAnalyticalPricer::u1Term
          (VarianceSwapsHestonAnalyticalPricer *this,double t1,double t2)

{
  double dVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  complex<double> __r;
  complex<double> D1;
  complex<double> C1;
  double local_48;
  double dStack_40;
  double local_38 [2];
  double local_28;
  double dStack_20;
  
  dVar2 = t2 - t1;
  dVar1 = HestonModel::getInitialVolatility(this->hestonModel_);
  dVar3 = 0.0;
  functionCPrime(this,dVar2,0.0);
  local_28 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  dStack_20 = dVar3;
  functionCSecond(this,dVar2,0.0);
  uVar4 = 0;
  functionDPrime(this,dVar2,0.0);
  local_38[0] = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
  local_38[1] = (double)uVar4;
  functionDSecond(this,dVar2,0.0);
  local_48 = local_38[0];
  dStack_40 = local_38[1];
  std::complex<double>::operator*=((complex<double> *)&local_48,(complex<double> *)local_38);
  dVar3 = local_48 * dVar1;
  local_48 = local_28 + local_28;
  dStack_40 = dStack_20 + dStack_20;
  std::complex<double>::operator*=((complex<double> *)&local_48,(complex<double> *)local_38);
  dVar2 = local_48 - (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
  local_48 = local_28;
  dStack_40 = dStack_20;
  std::complex<double>::operator*=((complex<double> *)&local_48,(complex<double> *)&local_28);
  return (local_48 - (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00)) +
         dVar2 * dVar1 + dVar3 * dVar1;
}

Assistant:

double VarianceSwapsHestonAnalyticalPricer::
u1Term(double t1, double t2) const {
    double delta = t2-t1,
           v0 = hestonModel_->getInitialVolatility();
    std::complex<double> C1 = functionCPrime(delta,0.),
                        C2 = functionCSecond(delta,0.),
                        D1 = functionDPrime(delta,0.),
                        D2 = functionDSecond(delta,0.);
    std::complex<double> firstTerm = D1*D1*v0*v0,
                        secondTerm = v0*(2.0*C1*D1-D2),
                        thirdTerm = C1*C1 - C2;
    std::complex<double> u1 = firstTerm+secondTerm+thirdTerm; 
    return u1.real();
}